

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

CaseRequirement *
glu::sl::CaseRequirement::createAnyExtensionRequirement
          (CaseRequirement *__return_storage_ptr__,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *alternatives,deUint32 effectiveStages)

{
  RequiredExtension local_40;
  undefined1 local_1d;
  deUint32 local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  deUint32 effectiveStages_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *alternatives_local;
  CaseRequirement *req;
  
  local_1d = 0;
  local_1c = effectiveStages;
  pvStack_18 = alternatives;
  alternatives_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)__return_storage_ptr__;
  CaseRequirement(__return_storage_ptr__);
  __return_storage_ptr__->type = TYPE_EXTENSION;
  RequiredExtension::RequiredExtension(&local_40,pvStack_18,local_1c);
  RequiredExtension::operator=(&__return_storage_ptr__->extension,&local_40);
  RequiredExtension::~RequiredExtension(&local_40);
  return __return_storage_ptr__;
}

Assistant:

static CaseRequirement createAnyExtensionRequirement (const vector<string>& alternatives, deUint32 effectiveStages)
	{
		CaseRequirement req;
		req.type		= TYPE_EXTENSION;
		req.extension	= RequiredExtension(alternatives, effectiveStages);
		return req;
	}